

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void Catch::writeCounts(JsonObjectWriter *writer,Counts *counts)

{
  JsonValueWriter *pJVar1;
  JsonValueWriter *in_RDI;
  StringRef SVar2;
  unsigned_long *in_stack_fffffffffffff8f8;
  JsonValueWriter *in_stack_fffffffffffff900;
  char *local_6c0;
  size_t local_6b8;
  JsonObjectWriter local_6b0 [17];
  StringRef local_518;
  JsonObjectWriter local_508 [17];
  StringRef local_370;
  JsonObjectWriter local_360 [17];
  StringRef local_1b8;
  JsonObjectWriter local_1a8 [17];
  JsonValueWriter *local_8;
  
  local_8 = in_RDI;
  local_1b8 = operator____sr((char *)in_stack_fffffffffffff900,(size_t)in_stack_fffffffffffff8f8);
  JsonObjectWriter::write(local_1a8,(int)in_RDI,local_1b8.m_start,local_1b8.m_size);
  JsonValueWriter::write<unsigned_long>(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a3ded);
  pJVar1 = local_8;
  local_370 = operator____sr((char *)in_stack_fffffffffffff900,(size_t)in_stack_fffffffffffff8f8);
  JsonObjectWriter::write(local_360,(int)pJVar1,local_370.m_start,local_370.m_size);
  JsonValueWriter::write<unsigned_long>(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a3e67);
  pJVar1 = local_8;
  local_518 = operator____sr((char *)in_stack_fffffffffffff900,(size_t)in_stack_fffffffffffff8f8);
  JsonObjectWriter::write(local_508,(int)pJVar1,local_518.m_start,local_518.m_size);
  JsonValueWriter::write<unsigned_long>(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a3ee1);
  SVar2 = operator____sr((char *)local_8,(size_t)in_stack_fffffffffffff8f8);
  local_6c0 = SVar2.m_start;
  local_6b8 = SVar2.m_size;
  JsonObjectWriter::write(local_6b0,(int)local_8,local_6c0,local_6b8);
  JsonValueWriter::write<unsigned_long>(local_8,in_stack_fffffffffffff8f8);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a3f49);
  return;
}

Assistant:

static void writeCounts( JsonObjectWriter&& writer, Counts const& counts ) {
        writer.write( "passed"_sr ).write( counts.passed );
        writer.write( "failed"_sr ).write( counts.failed );
        writer.write( "fail-but-ok"_sr ).write( counts.failedButOk );
        writer.write( "skipped"_sr ).write( counts.skipped );
    }